

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test23(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  qpdflogger_handle l3;
  qpdflogger_handle l;
  qpdflogger_handle l2;
  qpdflogger_handle l1;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  uVar3 = qpdf_get_logger(qpdf);
  local_20 = uVar3;
  local_28 = qpdflogger_default_logger();
  iVar1 = qpdflogger_equal(uVar3,local_28);
  if (iVar1 == 0) {
    __assert_fail("qpdflogger_equal(l1, l2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x1e8,"void test23(const char *, const char *, const char *, const char *)");
  }
  qpdflogger_cleanup(&local_20);
  qpdflogger_cleanup(&local_28);
  uVar3 = qpdflogger_create();
  local_30 = uVar3;
  qpdflogger_set_warn(uVar3,4,custom_log,0);
  qpdf_set_logger(qpdf,uVar3);
  local_38 = qpdf_get_logger(qpdf);
  iVar1 = qpdflogger_equal(uVar3,local_38);
  if (iVar1 != 0) {
    qpdflogger_cleanup(&local_30);
    qpdflogger_cleanup(&local_38);
    qpdf_read(qpdf,infile,password);
    uVar2 = qpdf_check_pdf(qpdf);
    printf("status: %d\n",(ulong)uVar2);
    report_errors();
    return;
  }
  __assert_fail("qpdflogger_equal(l, l3)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x1ef,"void test23(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test23(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Test check and also exercise custom logger */
    qpdflogger_handle l1 = qpdf_get_logger(qpdf);
    qpdflogger_handle l2 = qpdflogger_default_logger();
    assert(qpdflogger_equal(l1, l2));
    qpdflogger_cleanup(&l1);
    qpdflogger_cleanup(&l2);
    qpdflogger_handle l = qpdflogger_create();
    qpdflogger_set_warn(l, qpdf_log_dest_custom, custom_log, NULL);
    qpdf_set_logger(qpdf, l);
    qpdflogger_handle l3 = qpdf_get_logger(qpdf);
    assert(qpdflogger_equal(l, l3));
    qpdflogger_cleanup(&l);
    qpdflogger_cleanup(&l3);

    QPDF_ERROR_CODE status = 0;
    qpdf_read(qpdf, infile, password);
    status = qpdf_check_pdf(qpdf);
    printf("status: %d\n", status);
    report_errors();
}